

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::SquareMatrix::SquareMatrix(SquareMatrix *this,ListRecord *list)

{
  ListRecord::ListRecord(&this->super_ListRecord,list);
  verifyLB((int)((_Head_base<3UL,_long,_false> *)
                ((long)&(this->super_ListRecord).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl);
  verifySize((int)(this->super_ListRecord).metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                  _M_head_impl,
             *(int *)&(this->super_ListRecord).metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>,
             (int)((ulong)((long)(this->super_ListRecord).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(this->super_ListRecord).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3));
  return;
}

Assistant:

SquareMatrix( ListRecord&& list ) :
  ListRecord( std::move( list ) ) {

    verifyLB( this->LB() );
    verifySize( this->LS(), this->NE(), this->NT() );
}